

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O1

bool deqp::egl::operator==(SurfaceConfig *a,SurfaceConfig *b)

{
  _Rb_tree_color attribute;
  deInt32 dVar1;
  deInt32 dVar2;
  _Base_ptr p_Var3;
  _Self __tmp;
  bool bVar4;
  map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
  defaultRules;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_deqp::egl::AttribRule>,_std::_Select1st<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
  local_60;
  
  SurfaceConfig::getDefaultRules();
  bVar4 = (_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left ==
          &local_60._M_impl.super__Rb_tree_header;
  if (!bVar4) {
    p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      attribute = p_Var3[1]._M_color;
      dVar1 = eglu::ConfigInfo::getAttribute(&a->m_info,attribute);
      dVar2 = eglu::ConfigInfo::getAttribute(&b->m_info,attribute);
      if (dVar1 != dVar2) break;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      bVar4 = (_Rb_tree_header *)p_Var3 == &local_60._M_impl.super__Rb_tree_header;
    } while (!bVar4);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_deqp::egl::AttribRule>,_std::_Select1st<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
  ::~_Rb_tree(&local_60);
  return bVar4;
}

Assistant:

bool operator== (const SurfaceConfig& a, const SurfaceConfig& b)
	{
		const std::map<EGLenum, AttribRule> defaultRules = getDefaultRules();

		for (std::map<EGLenum, AttribRule>::const_iterator iter = defaultRules.begin(); iter != defaultRules.end(); iter++)
		{
			const EGLenum attribute = iter->first;

			if (a.getAttribute(attribute) != b.getAttribute(attribute)) return false;
		}
		return true;
	}